

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

IrSim * __thiscall IrSim::commitIc(IrSim *this,C_IC *ic)

{
  int iVar1;
  pointer pIVar2;
  pointer pIVar3;
  __type _Var4;
  mapped_type_conflict *pmVar5;
  InterCode IStack_b8;
  
  iVar1 = ic->kind;
  if ((iVar1 != 0) && ((ic->target).kind != 0)) {
    if (iVar1 == 0x10) {
      pIVar2 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pIVar3 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->labels,&(ic->target).value);
      *pmVar5 = (mapped_type_conflict)(((long)pIVar2 - (long)pIVar3) / 0x98);
    }
    else if ((((iVar1 == 9) &&
              (pIVar2 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
              pIVar2 != (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                        _M_impl.super__Vector_impl_data._M_start)) && (pIVar2[-1].kind == 6)) &&
            (_Var4 = std::operator==(&pIVar2[-1].target.value,&(ic->target).value), _Var4)) {
      icArgAddr(&IStack_b8,this,&pIVar2[-1].arg1);
      InterCode::operator=(pIVar2 + -1,&IStack_b8);
      InterCode::~InterCode(&IStack_b8);
      return this;
    }
    std::vector<InterCode,_std::allocator<InterCode>_>::push_back(&this->irList,ic);
  }
  return this;
}

Assistant:

IrSim &IrSim::commitIc(C_IC &ic) {
    if (!ic.kind || !ic[0].kind)
        return *this;
    if (ic.kind == IC_ARG) {
        auto it = irList.rbegin();
        if (it != irList.rend() && it->kind == IC_REF && it->target.value == ic.target.value) {
            *it = icArgAddr(it->arg1);
            return *this;
        }
    }
    else if (ic.kind == IC_LABEL) {
        labels[ic.target.value] = (int)irList.size();
    }
    irList.push_back(ic);
    return *this;
}